

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.c
# Opt level: O3

int mbedtls_pem_read_buffer
              (mbedtls_pem_context *ctx,char *header,char *footer,uchar *data,uchar *pwd,
              size_t pwdlen,size_t *use_len)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  uchar *puVar5;
  size_t sVar6;
  ulong uVar7;
  uint keylen;
  size_t slen;
  undefined4 uVar8;
  uchar *puVar9;
  long *plVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  size_t len;
  uchar pem_iv [16];
  size_t local_68;
  uchar *local_60;
  uchar local_58 [24];
  size_t local_40;
  uchar *local_38;
  
  if (ctx == (mbedtls_pem_context *)0x0) {
    return -0x1480;
  }
  local_40 = pwdlen;
  local_38 = pwd;
  puVar5 = (uchar *)strstr((char *)data,header);
  if (puVar5 == (uchar *)0x0) {
    return -0x1080;
  }
  local_60 = (uchar *)strstr((char *)data,footer);
  if (local_60 <= puVar5) {
    return -0x1080;
  }
  sVar6 = strlen(header);
  lVar2 = (puVar5[sVar6] == ' ') + sVar6;
  if (puVar5[(ulong)(puVar5[(puVar5[sVar6] == ' ') + sVar6] == '\r') + lVar2] != '\n') {
    return -0x1080;
  }
  lVar2 = (ulong)(puVar5[(puVar5[sVar6] == ' ') + sVar6] == '\r') + lVar2;
  puVar9 = puVar5 + lVar2 + 1;
  sVar6 = strlen(footer);
  lVar3 = (local_60[sVar6] == ' ') + sVar6;
  *use_len = (size_t)(local_60 +
                     (((ulong)(local_60[(ulong)(local_60[(local_60[sVar6] == ' ') + sVar6] == '\r')
                                        + lVar3] == '\n') +
                      (ulong)(local_60[(local_60[sVar6] == ' ') + sVar6] == '\r') + lVar3) -
                     (long)data));
  bVar1 = true;
  uVar8 = 0;
  if ((0x15 < (long)local_60 - (long)puVar9) &&
     (auVar17[0] = -(puVar5[lVar2 + 7] == 'y'), auVar17[1] = -(puVar5[lVar2 + 8] == 'p'),
     auVar17[2] = -(puVar5[lVar2 + 9] == 'e'), auVar17[3] = -(puVar5[lVar2 + 10] == ':'),
     auVar17[4] = -(puVar5[lVar2 + 0xb] == ' '), auVar17[5] = -(puVar5[lVar2 + 0xc] == '4'),
     auVar17[6] = -(puVar5[lVar2 + 0xd] == ','), auVar17[7] = -(puVar5[lVar2 + 0xe] == 'E'),
     auVar17[8] = -(puVar5[lVar2 + 0xf] == 'N'), auVar17[9] = -(puVar5[lVar2 + 0x10] == 'C'),
     auVar17[10] = -(puVar5[lVar2 + 0x11] == 'R'), auVar17[0xb] = -(puVar5[lVar2 + 0x12] == 'Y'),
     auVar17[0xc] = -(puVar5[lVar2 + 0x13] == 'P'), auVar17[0xd] = -(puVar5[lVar2 + 0x14] == 'T'),
     auVar17[0xe] = -(puVar5[lVar2 + 0x15] == 'E'), auVar17[0xf] = -(puVar5[lVar2 + 0x16] == 'D'),
     auVar11[0] = -(*puVar9 == 'P'), auVar11[1] = -(puVar5[lVar2 + 2] == 'r'),
     auVar11[2] = -(puVar5[lVar2 + 3] == 'o'), auVar11[3] = -(puVar5[lVar2 + 4] == 'c'),
     auVar11[4] = -(puVar5[lVar2 + 5] == '-'), auVar11[5] = -(puVar5[lVar2 + 6] == 'T'),
     auVar11[6] = -(puVar5[lVar2 + 7] == 'y'), auVar11[7] = -(puVar5[lVar2 + 8] == 'p'),
     auVar11[8] = -(puVar5[lVar2 + 9] == 'e'), auVar11[9] = -(puVar5[lVar2 + 10] == ':'),
     auVar11[10] = -(puVar5[lVar2 + 0xb] == ' '), auVar11[0xb] = -(puVar5[lVar2 + 0xc] == '4'),
     auVar11[0xc] = -(puVar5[lVar2 + 0xd] == ','), auVar11[0xd] = -(puVar5[lVar2 + 0xe] == 'E'),
     auVar11[0xe] = -(puVar5[lVar2 + 0xf] == 'N'), auVar11[0xf] = -(puVar5[lVar2 + 0x10] == 'C'),
     auVar11 = auVar11 & auVar17, uVar8 = 0,
     (ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
             (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) == 0xffff)) {
    lVar3 = lVar2 + 0x17;
    if (puVar5[lVar2 + 0x17] == '\r') {
      lVar3 = lVar2 + 0x18;
    }
    puVar9 = puVar5 + lVar3;
    if (puVar5[(ulong)(puVar5[lVar2 + 0x17] == '\r') + 0x17 + lVar2] != '\n') {
      return -0x1100;
    }
    plVar10 = (long *)(puVar9 + 1);
    if ((long)local_60 - (long)plVar10 < 0x17) {
      if (0x11 < (long)local_60 - (long)plVar10) goto LAB_001269d4;
LAB_00126a03:
      uVar8 = 0;
      bVar1 = true;
    }
    else {
      auVar18[0] = -(puVar9[8] == 'o');
      auVar18[1] = -(puVar9[9] == ':');
      auVar18[2] = -(puVar9[10] == ' ');
      auVar18[3] = -(puVar9[0xb] == 'D');
      auVar18[4] = -(puVar9[0xc] == 'E');
      auVar18[5] = -(puVar9[0xd] == 'S');
      auVar18[6] = -(puVar9[0xe] == '-');
      auVar18[7] = -(puVar9[0xf] == 'E');
      auVar18[8] = -(puVar9[0x10] == 'D');
      auVar18[9] = -(puVar9[0x11] == 'E');
      auVar18[10] = -(puVar9[0x12] == '3');
      auVar18[0xb] = -(puVar9[0x13] == '-');
      auVar18[0xc] = -(puVar9[0x14] == 'C');
      auVar18[0xd] = -(puVar9[0x15] == 'B');
      auVar18[0xe] = -(puVar9[0x16] == 'C');
      auVar18[0xf] = -(puVar9[0x17] == ',');
      auVar12[0] = -((char)*plVar10 == 'D');
      auVar12[1] = -(puVar9[2] == 'E');
      auVar12[2] = -(puVar9[3] == 'K');
      auVar12[3] = -(puVar9[4] == '-');
      auVar12[4] = -(puVar9[5] == 'I');
      auVar12[5] = -(puVar9[6] == 'n');
      auVar12[6] = -(puVar9[7] == 'f');
      auVar12[7] = -(puVar9[8] == 'o');
      auVar12[8] = -(puVar9[9] == ':');
      auVar12[9] = -(puVar9[10] == ' ');
      auVar12[10] = -(puVar9[0xb] == 'D');
      auVar12[0xb] = -(puVar9[0xc] == 'E');
      auVar12[0xc] = -(puVar9[0xd] == 'S');
      auVar12[0xd] = -(puVar9[0xe] == '-');
      auVar12[0xe] = -(puVar9[0xf] == 'E');
      auVar12[0xf] = -(puVar9[0x10] == 'D');
      auVar12 = auVar12 & auVar18;
      if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) == 0xffff) {
        if ((long)local_60 - (long)(puVar9 + 0x18) < 0x10) {
          return -0x1200;
        }
        iVar4 = pem_get_iv(puVar9 + 0x18,local_58,8);
        if (iVar4 != 0) {
          return -0x1200;
        }
        plVar10 = (long *)(puVar9 + 0x28);
        uVar8 = 0x25;
      }
      else {
LAB_001269d4:
        auVar13[0] = -((char)*plVar10 == 'D');
        auVar13[1] = -(puVar9[2] == 'E');
        auVar13[2] = -(puVar9[3] == 'K');
        auVar13[3] = -(puVar9[4] == '-');
        auVar13[4] = -(puVar9[5] == 'I');
        auVar13[5] = -(puVar9[6] == 'n');
        auVar13[6] = -(puVar9[7] == 'f');
        auVar13[7] = -(puVar9[8] == 'o');
        auVar13[8] = -(puVar9[9] == ':');
        auVar13[9] = -(puVar9[10] == ' ');
        auVar13[10] = -(puVar9[0xb] == 'D');
        auVar13[0xb] = -(puVar9[0xc] == 'E');
        auVar13[0xc] = -(puVar9[0xd] == 'S');
        auVar13[0xd] = -(puVar9[0xe] == '-');
        auVar13[0xe] = -(puVar9[0xf] == 'C');
        auVar13[0xf] = -(puVar9[0x10] == 'B');
        auVar19[0] = -((char)*(undefined2 *)(puVar9 + 0x11) == 'C');
        auVar19[1] = -((char)((ushort)*(undefined2 *)(puVar9 + 0x11) >> 8) == ',');
        auVar19[2] = 0xff;
        auVar19[3] = 0xff;
        auVar19[4] = 0xff;
        auVar19[5] = 0xff;
        auVar19[6] = 0xff;
        auVar19[7] = 0xff;
        auVar19[8] = 0xff;
        auVar19[9] = 0xff;
        auVar19[10] = 0xff;
        auVar19[0xb] = 0xff;
        auVar19[0xc] = 0xff;
        auVar19[0xd] = 0xff;
        auVar19[0xe] = 0xff;
        auVar19[0xf] = 0xff;
        auVar19 = auVar19 & auVar13;
        if ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00126a03;
        if ((long)local_60 - (long)(puVar9 + 0x13) < 0x10) {
          return -0x1200;
        }
        iVar4 = pem_get_iv(puVar9 + 0x13,local_58,8);
        if (iVar4 != 0) {
          return -0x1200;
        }
        plVar10 = (long *)(puVar9 + 0x23);
        uVar8 = 0x21;
      }
      bVar1 = false;
    }
    if (((long)local_60 - (long)plVar10 < 0xe) ||
       (*(long *)((long)plVar10 + 6) != 0x2d534541203a6f66 || *plVar10 != 0x6f666e492d4b4544)) {
      if (bVar1) {
        return -0x1280;
      }
    }
    else {
      if ((ulong)((long)local_60 - (long)plVar10) < 0x16) {
        return -0x1280;
      }
      auVar20[0] = -(*(char *)((long)plVar10 + 6) == 'f');
      auVar20[1] = -(*(char *)((long)plVar10 + 7) == 'o');
      auVar20[2] = -((char)plVar10[1] == ':');
      auVar20[3] = -(*(char *)((long)plVar10 + 9) == ' ');
      auVar20[4] = -(*(char *)((long)plVar10 + 10) == 'A');
      auVar20[5] = -(*(char *)((long)plVar10 + 0xb) == 'E');
      auVar20[6] = -(*(char *)((long)plVar10 + 0xc) == 'S');
      auVar20[7] = -(*(char *)((long)plVar10 + 0xd) == '-');
      auVar20[8] = -(*(char *)((long)plVar10 + 0xe) == '1');
      auVar20[9] = -(*(char *)((long)plVar10 + 0xf) == '2');
      auVar20[10] = -((char)plVar10[2] == '8');
      auVar20[0xb] = -(*(char *)((long)plVar10 + 0x11) == '-');
      auVar20[0xc] = -(*(char *)((long)plVar10 + 0x12) == 'C');
      auVar20[0xd] = -(*(char *)((long)plVar10 + 0x13) == 'B');
      auVar20[0xe] = -(*(char *)((long)plVar10 + 0x14) == 'C');
      auVar20[0xf] = -(*(char *)((long)plVar10 + 0x15) == ',');
      auVar14[0] = -((char)*plVar10 == 'D');
      auVar14[1] = -(*(char *)((long)plVar10 + 1) == 'E');
      auVar14[2] = -(*(char *)((long)plVar10 + 2) == 'K');
      auVar14[3] = -(*(char *)((long)plVar10 + 3) == '-');
      auVar14[4] = -(*(char *)((long)plVar10 + 4) == 'I');
      auVar14[5] = -(*(char *)((long)plVar10 + 5) == 'n');
      auVar14[6] = -(*(char *)((long)plVar10 + 6) == 'f');
      auVar14[7] = -(*(char *)((long)plVar10 + 7) == 'o');
      auVar14[8] = -((char)plVar10[1] == ':');
      auVar14[9] = -(*(char *)((long)plVar10 + 9) == ' ');
      auVar14[10] = -(*(char *)((long)plVar10 + 10) == 'A');
      auVar14[0xb] = -(*(char *)((long)plVar10 + 0xb) == 'E');
      auVar14[0xc] = -(*(char *)((long)plVar10 + 0xc) == 'S');
      auVar14[0xd] = -(*(char *)((long)plVar10 + 0xd) == '-');
      auVar14[0xe] = -(*(char *)((long)plVar10 + 0xe) == '1');
      auVar14[0xf] = -(*(char *)((long)plVar10 + 0xf) == '2');
      auVar14 = auVar14 & auVar20;
      if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) == 0xffff) {
        uVar8 = 5;
      }
      else {
        auVar21[0] = -(*(char *)((long)plVar10 + 6) == 'f');
        auVar21[1] = -(*(char *)((long)plVar10 + 7) == 'o');
        auVar21[2] = -((char)plVar10[1] == ':');
        auVar21[3] = -(*(char *)((long)plVar10 + 9) == ' ');
        auVar21[4] = -(*(char *)((long)plVar10 + 10) == 'A');
        auVar21[5] = -(*(char *)((long)plVar10 + 0xb) == 'E');
        auVar21[6] = -(*(char *)((long)plVar10 + 0xc) == 'S');
        auVar21[7] = -(*(char *)((long)plVar10 + 0xd) == '-');
        auVar21[8] = -(*(char *)((long)plVar10 + 0xe) == '1');
        auVar21[9] = -(*(char *)((long)plVar10 + 0xf) == '9');
        auVar21[10] = -((char)plVar10[2] == '2');
        auVar21[0xb] = -(*(char *)((long)plVar10 + 0x11) == '-');
        auVar21[0xc] = -(*(char *)((long)plVar10 + 0x12) == 'C');
        auVar21[0xd] = -(*(char *)((long)plVar10 + 0x13) == 'B');
        auVar21[0xe] = -(*(char *)((long)plVar10 + 0x14) == 'C');
        auVar21[0xf] = -(*(char *)((long)plVar10 + 0x15) == ',');
        auVar15[0] = -((char)*plVar10 == 'D');
        auVar15[1] = -(*(char *)((long)plVar10 + 1) == 'E');
        auVar15[2] = -(*(char *)((long)plVar10 + 2) == 'K');
        auVar15[3] = -(*(char *)((long)plVar10 + 3) == '-');
        auVar15[4] = -(*(char *)((long)plVar10 + 4) == 'I');
        auVar15[5] = -(*(char *)((long)plVar10 + 5) == 'n');
        auVar15[6] = -(*(char *)((long)plVar10 + 6) == 'f');
        auVar15[7] = -(*(char *)((long)plVar10 + 7) == 'o');
        auVar15[8] = -((char)plVar10[1] == ':');
        auVar15[9] = -(*(char *)((long)plVar10 + 9) == ' ');
        auVar15[10] = -(*(char *)((long)plVar10 + 10) == 'A');
        auVar15[0xb] = -(*(char *)((long)plVar10 + 0xb) == 'E');
        auVar15[0xc] = -(*(char *)((long)plVar10 + 0xc) == 'S');
        auVar15[0xd] = -(*(char *)((long)plVar10 + 0xd) == '-');
        auVar15[0xe] = -(*(char *)((long)plVar10 + 0xe) == '1');
        auVar15[0xf] = -(*(char *)((long)plVar10 + 0xf) == '9');
        auVar15 = auVar15 & auVar21;
        if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) == 0xffff) {
          uVar8 = 6;
        }
        else {
          auVar22[0] = -(*(char *)((long)plVar10 + 6) == 'f');
          auVar22[1] = -(*(char *)((long)plVar10 + 7) == 'o');
          auVar22[2] = -((char)plVar10[1] == ':');
          auVar22[3] = -(*(char *)((long)plVar10 + 9) == ' ');
          auVar22[4] = -(*(char *)((long)plVar10 + 10) == 'A');
          auVar22[5] = -(*(char *)((long)plVar10 + 0xb) == 'E');
          auVar22[6] = -(*(char *)((long)plVar10 + 0xc) == 'S');
          auVar22[7] = -(*(char *)((long)plVar10 + 0xd) == '-');
          auVar22[8] = -(*(char *)((long)plVar10 + 0xe) == '2');
          auVar22[9] = -(*(char *)((long)plVar10 + 0xf) == '5');
          auVar22[10] = -((char)plVar10[2] == '6');
          auVar22[0xb] = -(*(char *)((long)plVar10 + 0x11) == '-');
          auVar22[0xc] = -(*(char *)((long)plVar10 + 0x12) == 'C');
          auVar22[0xd] = -(*(char *)((long)plVar10 + 0x13) == 'B');
          auVar22[0xe] = -(*(char *)((long)plVar10 + 0x14) == 'C');
          auVar22[0xf] = -(*(char *)((long)plVar10 + 0x15) == ',');
          auVar16[0] = -((char)*plVar10 == 'D');
          auVar16[1] = -(*(char *)((long)plVar10 + 1) == 'E');
          auVar16[2] = -(*(char *)((long)plVar10 + 2) == 'K');
          auVar16[3] = -(*(char *)((long)plVar10 + 3) == '-');
          auVar16[4] = -(*(char *)((long)plVar10 + 4) == 'I');
          auVar16[5] = -(*(char *)((long)plVar10 + 5) == 'n');
          auVar16[6] = -(*(char *)((long)plVar10 + 6) == 'f');
          auVar16[7] = -(*(char *)((long)plVar10 + 7) == 'o');
          auVar16[8] = -((char)plVar10[1] == ':');
          auVar16[9] = -(*(char *)((long)plVar10 + 9) == ' ');
          auVar16[10] = -(*(char *)((long)plVar10 + 10) == 'A');
          auVar16[0xb] = -(*(char *)((long)plVar10 + 0xb) == 'E');
          auVar16[0xc] = -(*(char *)((long)plVar10 + 0xc) == 'S');
          auVar16[0xd] = -(*(char *)((long)plVar10 + 0xd) == '-');
          auVar16[0xe] = -(*(char *)((long)plVar10 + 0xe) == '2');
          auVar16[0xf] = -(*(char *)((long)plVar10 + 0xf) == '5');
          auVar16 = auVar16 & auVar22;
          if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) != 0xffff) {
            return -0x1280;
          }
          uVar8 = 7;
        }
      }
      if ((long)local_60 - ((long)plVar10 + 0x16) < 0x20) {
        return -0x1200;
      }
      iVar4 = pem_get_iv((uchar *)((long)plVar10 + 0x16),local_58,0x10);
      if (iVar4 != 0) {
        return -0x1200;
      }
      plVar10 = (long *)((long)plVar10 + 0x36);
    }
    uVar7 = (ulong)((char)*plVar10 == '\r');
    if (*(char *)((long)plVar10 + uVar7) != '\n') {
      return -0x1100;
    }
    puVar9 = (uchar *)((long)plVar10 + uVar7 + 1);
    bVar1 = false;
  }
  if (local_60 <= puVar9) {
    return -0x1100;
  }
  slen = (long)local_60 - (long)puVar9;
  iVar4 = mbedtls_base64_decode((uchar *)0x0,0,&local_68,puVar9,slen);
  sVar6 = local_68;
  if (iVar4 == -0x2c) {
    return -0x112c;
  }
  puVar5 = (uchar *)calloc(1,local_68);
  if (puVar5 == (uchar *)0x0) {
    return -0x1180;
  }
  local_60 = (uchar *)CONCAT44(local_60._4_4_,uVar8);
  iVar4 = mbedtls_base64_decode(puVar5,sVar6,&local_68,puVar9,slen);
  if (iVar4 != 0) {
    mbedtls_platform_zeroize(puVar5,local_68);
    free(puVar5);
    return iVar4 + -0x1100;
  }
  if (bVar1) goto LAB_001269c0;
  if (local_38 == (uchar *)0x0) {
    mbedtls_platform_zeroize(puVar5,local_68);
    free(puVar5);
    return -0x1300;
  }
  if ((int)local_60 < 7) {
    if ((int)local_60 == 5) {
      keylen = 0x10;
LAB_00126c31:
      iVar4 = pem_aes_decrypt(local_58,keylen,puVar5,local_68,local_38,local_40);
      goto LAB_00126c36;
    }
    if ((int)local_60 == 6) {
      keylen = 0x18;
      goto LAB_00126c31;
    }
  }
  else {
    if ((int)local_60 == 7) {
      keylen = 0x20;
      goto LAB_00126c31;
    }
    if ((int)local_60 == 0x21) {
      iVar4 = pem_des_decrypt(local_58,puVar5,local_68,local_38,local_40);
    }
    else {
      if ((int)local_60 != 0x25) goto LAB_00126c49;
      iVar4 = pem_des3_decrypt(local_58,puVar5,local_68,local_38,local_40);
    }
LAB_00126c36:
    if (iVar4 != 0) {
      free(puVar5);
      return iVar4;
    }
  }
LAB_00126c49:
  if (((local_68 < 3) || (*puVar5 != '0')) || (0x83 < puVar5[1])) {
    mbedtls_platform_zeroize(puVar5,local_68);
    free(puVar5);
    return -0x1380;
  }
LAB_001269c0:
  ctx->buf = puVar5;
  ctx->buflen = local_68;
  return 0;
}

Assistant:

int mbedtls_pem_read_buffer( mbedtls_pem_context *ctx, const char *header, const char *footer,
                     const unsigned char *data, const unsigned char *pwd,
                     size_t pwdlen, size_t *use_len )
{
    int ret, enc;
    size_t len;
    unsigned char *buf;
    const unsigned char *s1, *s2, *end;
#if defined(MBEDTLS_MD5_C) && defined(MBEDTLS_CIPHER_MODE_CBC) &&         \
    ( defined(MBEDTLS_DES_C) || defined(MBEDTLS_AES_C) )
    unsigned char pem_iv[16];
    mbedtls_cipher_type_t enc_alg = MBEDTLS_CIPHER_NONE;
#else
    ((void) pwd);
    ((void) pwdlen);
#endif /* MBEDTLS_MD5_C && MBEDTLS_CIPHER_MODE_CBC &&
          ( MBEDTLS_AES_C || MBEDTLS_DES_C ) */

    if( ctx == NULL )
        return( MBEDTLS_ERR_PEM_BAD_INPUT_DATA );

    s1 = (unsigned char *) strstr( (const char *) data, header );

    if( s1 == NULL )
        return( MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT );

    s2 = (unsigned char *) strstr( (const char *) data, footer );

    if( s2 == NULL || s2 <= s1 )
        return( MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT );

    s1 += strlen( header );
    if( *s1 == ' '  ) s1++;
    if( *s1 == '\r' ) s1++;
    if( *s1 == '\n' ) s1++;
    else return( MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT );

    end = s2;
    end += strlen( footer );
    if( *end == ' '  ) end++;
    if( *end == '\r' ) end++;
    if( *end == '\n' ) end++;
    *use_len = end - data;

    enc = 0;

    if( s2 - s1 >= 22 && memcmp( s1, "Proc-Type: 4,ENCRYPTED", 22 ) == 0 )
    {
#if defined(MBEDTLS_MD5_C) && defined(MBEDTLS_CIPHER_MODE_CBC) &&         \
    ( defined(MBEDTLS_DES_C) || defined(MBEDTLS_AES_C) )
        enc++;

        s1 += 22;
        if( *s1 == '\r' ) s1++;
        if( *s1 == '\n' ) s1++;
        else return( MBEDTLS_ERR_PEM_INVALID_DATA );


#if defined(MBEDTLS_DES_C)
        if( s2 - s1 >= 23 && memcmp( s1, "DEK-Info: DES-EDE3-CBC,", 23 ) == 0 )
        {
            enc_alg = MBEDTLS_CIPHER_DES_EDE3_CBC;

            s1 += 23;
            if( s2 - s1 < 16 || pem_get_iv( s1, pem_iv, 8 ) != 0 )
                return( MBEDTLS_ERR_PEM_INVALID_ENC_IV );

            s1 += 16;
        }
        else if( s2 - s1 >= 18 && memcmp( s1, "DEK-Info: DES-CBC,", 18 ) == 0 )
        {
            enc_alg = MBEDTLS_CIPHER_DES_CBC;

            s1 += 18;
            if( s2 - s1 < 16 || pem_get_iv( s1, pem_iv, 8) != 0 )
                return( MBEDTLS_ERR_PEM_INVALID_ENC_IV );

            s1 += 16;
        }
#endif /* MBEDTLS_DES_C */

#if defined(MBEDTLS_AES_C)
        if( s2 - s1 >= 14 && memcmp( s1, "DEK-Info: AES-", 14 ) == 0 )
        {
            if( s2 - s1 < 22 )
                return( MBEDTLS_ERR_PEM_UNKNOWN_ENC_ALG );
            else if( memcmp( s1, "DEK-Info: AES-128-CBC,", 22 ) == 0 )
                enc_alg = MBEDTLS_CIPHER_AES_128_CBC;
            else if( memcmp( s1, "DEK-Info: AES-192-CBC,", 22 ) == 0 )
                enc_alg = MBEDTLS_CIPHER_AES_192_CBC;
            else if( memcmp( s1, "DEK-Info: AES-256-CBC,", 22 ) == 0 )
                enc_alg = MBEDTLS_CIPHER_AES_256_CBC;
            else
                return( MBEDTLS_ERR_PEM_UNKNOWN_ENC_ALG );

            s1 += 22;
            if( s2 - s1 < 32 || pem_get_iv( s1, pem_iv, 16 ) != 0 )
                return( MBEDTLS_ERR_PEM_INVALID_ENC_IV );

            s1 += 32;
        }
#endif /* MBEDTLS_AES_C */

        if( enc_alg == MBEDTLS_CIPHER_NONE )
            return( MBEDTLS_ERR_PEM_UNKNOWN_ENC_ALG );

        if( *s1 == '\r' ) s1++;
        if( *s1 == '\n' ) s1++;
        else return( MBEDTLS_ERR_PEM_INVALID_DATA );
#else
        return( MBEDTLS_ERR_PEM_FEATURE_UNAVAILABLE );
#endif /* MBEDTLS_MD5_C && MBEDTLS_CIPHER_MODE_CBC &&
          ( MBEDTLS_AES_C || MBEDTLS_DES_C ) */
    }

    if( s1 >= s2 )
        return( MBEDTLS_ERR_PEM_INVALID_DATA );

    ret = mbedtls_base64_decode( NULL, 0, &len, s1, s2 - s1 );

    if( ret == MBEDTLS_ERR_BASE64_INVALID_CHARACTER )
        return( MBEDTLS_ERR_PEM_INVALID_DATA + ret );

    if( ( buf = mbedtls_calloc( 1, len ) ) == NULL )
        return( MBEDTLS_ERR_PEM_ALLOC_FAILED );

    if( ( ret = mbedtls_base64_decode( buf, len, &len, s1, s2 - s1 ) ) != 0 )
    {
        mbedtls_platform_zeroize( buf, len );
        mbedtls_free( buf );
        return( MBEDTLS_ERR_PEM_INVALID_DATA + ret );
    }

    if( enc != 0 )
    {
#if defined(MBEDTLS_MD5_C) && defined(MBEDTLS_CIPHER_MODE_CBC) &&         \
    ( defined(MBEDTLS_DES_C) || defined(MBEDTLS_AES_C) )
        if( pwd == NULL )
        {
            mbedtls_platform_zeroize( buf, len );
            mbedtls_free( buf );
            return( MBEDTLS_ERR_PEM_PASSWORD_REQUIRED );
        }

        ret = 0;

#if defined(MBEDTLS_DES_C)
        if( enc_alg == MBEDTLS_CIPHER_DES_EDE3_CBC )
            ret = pem_des3_decrypt( pem_iv, buf, len, pwd, pwdlen );
        else if( enc_alg == MBEDTLS_CIPHER_DES_CBC )
            ret = pem_des_decrypt( pem_iv, buf, len, pwd, pwdlen );
#endif /* MBEDTLS_DES_C */

#if defined(MBEDTLS_AES_C)
        if( enc_alg == MBEDTLS_CIPHER_AES_128_CBC )
            ret = pem_aes_decrypt( pem_iv, 16, buf, len, pwd, pwdlen );
        else if( enc_alg == MBEDTLS_CIPHER_AES_192_CBC )
            ret = pem_aes_decrypt( pem_iv, 24, buf, len, pwd, pwdlen );
        else if( enc_alg == MBEDTLS_CIPHER_AES_256_CBC )
            ret = pem_aes_decrypt( pem_iv, 32, buf, len, pwd, pwdlen );
#endif /* MBEDTLS_AES_C */

        if( ret != 0 )
        {
            mbedtls_free( buf );
            return( ret );
        }

        /*
         * The result will be ASN.1 starting with a SEQUENCE tag, with 1 to 3
         * length bytes (allow 4 to be sure) in all known use cases.
         *
         * Use that as a heuristic to try to detect password mismatches.
         */
        if( len <= 2 || buf[0] != 0x30 || buf[1] > 0x83 )
        {
            mbedtls_platform_zeroize( buf, len );
            mbedtls_free( buf );
            return( MBEDTLS_ERR_PEM_PASSWORD_MISMATCH );
        }
#else
        mbedtls_platform_zeroize( buf, len );
        mbedtls_free( buf );
        return( MBEDTLS_ERR_PEM_FEATURE_UNAVAILABLE );
#endif /* MBEDTLS_MD5_C && MBEDTLS_CIPHER_MODE_CBC &&
          ( MBEDTLS_AES_C || MBEDTLS_DES_C ) */
    }

    ctx->buf = buf;
    ctx->buflen = len;

    return( 0 );
}